

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_functions.cpp
# Opt level: O3

void duckdb::EnumRangeBoundaryFunction(DataChunk *input,ExpressionState *state,Vector *result)

{
  uint uVar1;
  reference pvVar2;
  ulong uVar3;
  idx_t i;
  ulong uVar4;
  vector<duckdb::Value,_true> enum_values;
  vector<duckdb::LogicalType,_true> types;
  Value val;
  Value first_param;
  Value second_param;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_158;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_138;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_120;
  LogicalType local_108 [24];
  Value local_f0 [64];
  Value local_b0 [24];
  byte local_98;
  Value local_70 [24];
  char local_58;
  
  duckdb::DataChunk::GetTypes();
  duckdb::DataChunk::GetValue((ulong)local_b0,(ulong)input);
  duckdb::DataChunk::GetValue((ulong)local_70,(ulong)input);
  pvVar2 = vector<duckdb::LogicalType,_true>::operator[]
                     ((vector<duckdb::LogicalType,_true> *)&local_138,(ulong)local_98);
  duckdb::EnumType::GetValuesInsertOrder(pvVar2);
  if (local_98 == 0) {
    uVar1 = duckdb::Value::GetValue<unsigned_int>();
    uVar4 = (ulong)uVar1;
  }
  else {
    uVar4 = 0;
  }
  if (local_58 == '\x01') {
    pvVar2 = vector<duckdb::LogicalType,_true>::operator[]
                       ((vector<duckdb::LogicalType,_true> *)&local_138,0);
    uVar3 = duckdb::EnumType::GetSize(pvVar2);
  }
  else {
    uVar1 = duckdb::Value::GetValue<unsigned_int>();
    uVar3 = (ulong)(uVar1 + 1);
  }
  local_158.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (uVar4 < uVar3) {
    do {
      duckdb::Vector::GetValue((ulong)local_f0);
      std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                (&local_158,local_f0);
      duckdb::Value::~Value(local_f0);
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  duckdb::LogicalType::LogicalType(local_108,VARCHAR);
  std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector(&local_120,&local_158);
  duckdb::Value::LIST(local_f0,local_108,&local_120);
  std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(&local_120);
  duckdb::LogicalType::~LogicalType(local_108);
  duckdb::Vector::Reference((Value *)result);
  duckdb::Value::~Value(local_f0);
  std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(&local_158);
  duckdb::Value::~Value(local_70);
  duckdb::Value::~Value(local_b0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_138);
  return;
}

Assistant:

static void EnumRangeBoundaryFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto types = input.GetTypes();
	D_ASSERT(types.size() == 2);
	idx_t start, end;
	auto first_param = input.GetValue(0, 0);
	auto second_param = input.GetValue(1, 0);

	auto &enum_vector =
	    first_param.IsNull() ? EnumType::GetValuesInsertOrder(types[1]) : EnumType::GetValuesInsertOrder(types[0]);

	if (first_param.IsNull()) {
		start = 0;
	} else {
		start = first_param.GetValue<uint32_t>();
	}
	if (second_param.IsNull()) {
		end = EnumType::GetSize(types[0]);
	} else {
		end = second_param.GetValue<uint32_t>() + 1;
	}
	vector<Value> enum_values;
	for (idx_t i = start; i < end; i++) {
		enum_values.emplace_back(enum_vector.GetValue(i));
	}
	auto val = Value::LIST(LogicalType::VARCHAR, enum_values);
	result.Reference(val);
}